

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O0

UVec3 __thiscall
deqp::gles31::Functional::GlobalInvocationIDCase::computeReference
          (GlobalInvocationIDCase *this,UVec3 *numWorkGroups,UVec3 *workGroupSize,UVec3 *workGroupID
          ,UVec3 *localInvocationID)

{
  Vector<unsigned_int,_3> *in_R9;
  Vector<unsigned_int,_3> VVar1;
  UVec3 UVar2;
  Vector<unsigned_int,_3> local_44;
  Vector<unsigned_int,_3> *local_38;
  UVec3 *localInvocationID_local;
  UVec3 *workGroupID_local;
  UVec3 *workGroupSize_local;
  UVec3 *numWorkGroups_local;
  GlobalInvocationIDCase *this_local;
  
  local_38 = in_R9;
  localInvocationID_local = localInvocationID;
  workGroupID_local = workGroupID;
  workGroupSize_local = workGroupSize;
  numWorkGroups_local = numWorkGroups;
  this_local = this;
  tcu::operator*((tcu *)&local_44,localInvocationID,workGroupID);
  VVar1 = tcu::operator+((tcu *)this,&local_44,local_38);
  UVar2.m_data[2] = VVar1.m_data[2];
  UVar2.m_data._0_8_ = this;
  return (UVec3)UVar2.m_data;
}

Assistant:

UVec3 computeReference (const UVec3& numWorkGroups, const UVec3& workGroupSize, const UVec3& workGroupID, const UVec3& localInvocationID) const
	{
		DE_UNREF(numWorkGroups);
		return workGroupID * workGroupSize + localInvocationID;
	}